

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O1

bool __thiscall brynet::TimerMgr::CompareTimer::operator()(CompareTimer *this,Ptr *left,Ptr *right)

{
  time_point *ptVar1;
  time_point *ptVar2;
  nanoseconds *pnVar3;
  nanoseconds *pnVar4;
  long lVar5;
  long lVar6;
  
  ptVar1 = Timer::getStartTime((left->super___shared_ptr<brynet::Timer,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr);
  ptVar2 = Timer::getStartTime((right->super___shared_ptr<brynet::Timer,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr);
  lVar6 = (ptVar1->__d).__r;
  lVar5 = (ptVar2->__d).__r;
  pnVar3 = Timer::getLastTime((left->super___shared_ptr<brynet::Timer,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
  pnVar4 = Timer::getLastTime((right->super___shared_ptr<brynet::Timer,_(__gnu_cxx::_Lock_policy)2>)
                              ._M_ptr);
  lVar6 = lVar6 + pnVar3->__r;
  lVar5 = lVar5 + pnVar4->__r;
  return lVar6 != lVar5 && -1 < lVar6 - lVar5;
}

Assistant:

bool operator() (const Timer::Ptr& left, const Timer::Ptr& right) const
            {
                auto startDiff = left->getStartTime() - right->getStartTime();
                auto lastDiff = left->getLastTime() - right->getLastTime();
                auto diff = startDiff.count() + lastDiff.count();
                return diff > 0;
            }